

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift_helper_template.h
# Opt level: O0

target_ulong helper_rcll_x86_64(CPUX86State *env,target_ulong t0,target_ulong t1)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  sbyte sVar5;
  ulong local_38;
  target_long res;
  target_ulong src;
  int eflags;
  int count;
  target_ulong t1_local;
  target_ulong t0_local;
  CPUX86State *env_local;
  
  uVar1 = (uint)t1 & 0x1f;
  t1_local = t0;
  if ((t1 & 0x1f) != 0) {
    uVar2 = (uint)env->cc_src;
    uVar3 = t0 & 0xffffffff;
    sVar5 = (sbyte)uVar1;
    local_38 = uVar3 << sVar5 | (long)(int)(uVar2 & 1) << (sVar5 - 1U & 0x3f);
    if (1 < uVar1) {
      local_38 = uVar3 >> (0x21U - sVar5 & 0x3f) | local_38;
    }
    t1_local = local_38;
    uVar4 = lshift(uVar3 ^ local_38,-0x14);
    env->cc_src = (long)(int)(uVar2 & 0xfffff7fe) | uVar4 & 0x800 |
                  uVar3 >> (0x20U - sVar5 & 0x3f) & 1;
  }
  return t1_local;
}

Assistant:

target_ulong glue(helper_rcl, SUFFIX)(CPUX86State *env, target_ulong t0,
                                      target_ulong t1)
{
    int count, eflags;
    target_ulong src;
    target_long res;

    count = t1 & SHIFT1_MASK;
#if DATA_BITS == 16
    count = rclw_table[count];
#elif DATA_BITS == 8
    count = rclb_table[count];
#endif
    if (count) {
        eflags = (int)env->cc_src;
        t0 &= DATA_MASK;
        src = t0;
        res = (t0 << count) | ((target_ulong)(eflags & CC_C) << (count - 1));
        if (count > 1) {
            res |= t0 >> (DATA_BITS + 1 - count);
        }
        t0 = res;
        env->cc_src = (eflags & ~(CC_C | CC_O)) |
            (lshift(src ^ t0, 11 - (DATA_BITS - 1)) & CC_O) |
            ((src >> (DATA_BITS - count)) & CC_C);
    }
    return t0;
}